

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O1

void substitute_args(List *argval,List *argname,List *expr)

{
  TokenType TVar1;
  ListStruct *pLVar2;
  ListStruct *pLVar3;
  anon_union_8_7_0ba269be_for_u aVar4;
  char *pcVar5;
  unsigned_long uVar6;
  undefined4 uVar7;
  BOOL BVar8;
  List *pLVar9;
  ListStruct *ls;
  ListStruct *pLVar10;
  ListStruct *pLVar11;
  bool bVar12;
  
  bVar12 = argname == (List *)0x0;
  if (bVar12) {
LAB_00108788:
    ls = (List *)0x0;
  }
  else {
    TVar1 = (argname->token).type;
    ls = argval;
    pLVar10 = argname;
    while (TVar1 != TOK_TAIL) {
      pLVar10 = pLVar10->cdr;
      bVar12 = pLVar10 == (ListStruct *)0x0;
      if (bVar12) goto LAB_00108788;
      ls = ls->cdr;
      TVar1 = (pLVar10->token).type;
    }
  }
  if (expr != (List *)0x0) {
    do {
      TVar1 = (expr->token).type;
      if (TVar1 == TOK_LIST) {
        substitute_args(argval,argname,expr->car);
      }
      else if (TVar1 == TOK_TAIL) {
        if (bVar12) {
          parse_error(expr,"But this macro has no tail!\n");
        }
        pLVar9 = copy_list(ls);
        replace_list(expr,pLVar9);
      }
      else if ((TVar1 == TOK_IDENTIFIER) && (argval != (List *)0x0 && argname != (List *)0x0)) {
        pLVar10 = argname;
        pLVar11 = argval;
        while (((TVar1 = (pLVar10->token).type, TVar1 != TOK_TAIL && (TVar1 != TOK_IDENTIFIER)) ||
               (BVar8 = tokens_equal(&pLVar10->token,&expr->token), BVar8 == FALSE))) {
          pLVar10 = pLVar10->cdr;
          if ((pLVar10 == (ListStruct *)0x0) ||
             (pLVar11 = pLVar11->cdr, pLVar11 == (ListStruct *)0x0)) goto LAB_00108845;
        }
        pLVar10 = expr->cdr;
        pLVar2 = pLVar11->cdr;
        pLVar3 = pLVar11->car;
        uVar7 = *(undefined4 *)&(pLVar11->token).field_0x4;
        aVar4 = (pLVar11->token).u;
        pcVar5 = (pLVar11->token).filename;
        uVar6 = (pLVar11->token).lineno;
        (expr->token).type = (pLVar11->token).type;
        *(undefined4 *)&(expr->token).field_0x4 = uVar7;
        (expr->token).u = aVar4;
        (expr->token).filename = pcVar5;
        (expr->token).lineno = uVar6;
        expr->cdr = pLVar2;
        expr->car = pLVar3;
        pLVar9 = copy_list(pLVar11->car);
        expr->car = pLVar9;
        expr->cdr = pLVar10;
      }
LAB_00108845:
      expr = expr->cdr;
    } while (expr != (ListStruct *)0x0);
  }
  return;
}

Assistant:

static void
substitute_args (const List *argval, const List *argname, List *expr)
{
  const List *name, *val, *tail = NULL;
  BOOL has_tail = FALSE;

#ifdef DEBUG
  List *original_expr = expr;

  printf ("substitute_args: ");
  printf ("argval  = ");   print_list (argval, stdout);
  printf ("\nargname = "); print_list (argname, stdout);
  printf ("\nexpr    = "); print_list (expr, stdout);
  putchar ('\n');
#endif

  /* See if there is a +tail, and make it tail point to the list of args. */
  for (name = argname, val = argval; name != NULL;
       name = name->cdr, val = val->cdr)
    if (name->token.type == TOK_TAIL)
      {
	tail = val;
	has_tail = TRUE;
	break;
      }


  for (; expr != NULL; expr = expr->cdr)
    {
      switch (expr->token.type) {
      case TOK_LIST:
	substitute_args (argval, argname, expr->car);
	break;
      case TOK_IDENTIFIER:
	for (name = argname, val = argval; name != NULL && val != NULL;
	     name = name->cdr, val = val->cdr)
	  if (!IS_LITERAL (name) && tokens_equal (&name->token, &expr->token))
	    {
	      List *tmp_cdr = expr->cdr;
	      *expr = *val;
	      expr->car = copy_list (val->car);
	      expr->cdr = tmp_cdr;
	      break;
	    }
	break;
      case TOK_TAIL:
	if (!has_tail)
	  parse_error (expr, "But this macro has no tail!\n");
	replace_list (expr, copy_list (tail));
	break;

      default: break;
      }
    }

#ifdef DEBUG
  printf ("*** expr after argument substitutions:\n");
  print_list (original_expr, stdout);
  putchar ('\n');
#endif

}